

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_scroll.cpp
# Opt level: O2

void __thiscall DScroller::Tick(DScroller *this)

{
  EScrollPos EVar1;
  int iVar2;
  side_t *psVar3;
  TVector2<double> *pTVar4;
  splane *psVar5;
  double *pdVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double tdy;
  double tdx;
  double local_38;
  double dStack_30;
  
  dVar7 = this->m_dx;
  dVar9 = this->m_dy;
  if ((long)this->m_Control != -1) {
    local_38 = dVar7;
    dStack_30 = dVar9;
    dVar7 = sector_t::CenterFloor((sector_t *)(sectors + this->m_Control));
    dVar8 = sector_t::CenterCeiling((sector_t *)(sectors + this->m_Control));
    dVar9 = (dVar8 + dVar7) - this->m_LastHeight;
    this->m_LastHeight = dVar8 + dVar7;
    dVar7 = local_38 * dVar9;
    dVar9 = dStack_30 * dVar9;
  }
  if (this->m_Accel != 0) {
    dVar7 = dVar7 + this->m_vdx;
    dVar9 = dVar9 + this->m_vdy;
    this->m_vdx = dVar7;
    this->m_vdy = dVar9;
  }
  if ((((dVar7 == 0.0) && (!NAN(dVar7))) && (dVar9 == 0.0)) && (!NAN(dVar9))) {
    return;
  }
  switch(this->m_Type) {
  case sc_side:
    EVar1 = this->m_Parts;
    if ((EVar1 & scw_top) != 0) {
      dVar8 = sides[this->m_Affectee].textures[0].yOffset;
      psVar3 = sides + this->m_Affectee;
      psVar3->textures[0].xOffset = sides[this->m_Affectee].textures[0].xOffset + dVar7;
      psVar3->textures[0].yOffset = dVar8 + dVar9;
    }
    if ((EVar1 & scw_mid) != 0) {
      iVar2 = this->m_Affectee;
      if (((sides[iVar2].linedef)->backsector == (sector_t_conflict *)0x0) ||
         (((sides[iVar2].linedef)->flags & 0x200000) == 0)) {
        dVar8 = sides[iVar2].textures[1].yOffset;
        psVar3 = sides + iVar2;
        psVar3->textures[1].xOffset = dVar7 + sides[iVar2].textures[1].xOffset;
        psVar3->textures[1].yOffset = dVar9 + dVar8;
      }
    }
    if ((EVar1 & scw_bottom) == 0) {
      return;
    }
    pTVar4 = (TVector2<double> *)(sides[this->m_Affectee].textures + 2);
    break;
  case sc_floor:
    RotationComp(sectors + this->m_Affectee,0,dVar7,dVar9,&tdx,&tdy);
    psVar5 = sectors[this->m_Affectee].planes;
    goto LAB_004414c8;
  case sc_ceiling:
    RotationComp(sectors + this->m_Affectee,1,dVar7,dVar9,&tdx,&tdy);
    psVar5 = sectors[this->m_Affectee].planes + 1;
LAB_004414c8:
    pdVar6 = &(psVar5->xform).yOffs;
    (psVar5->xform).xOffs = tdx + (psVar5->xform).xOffs;
    goto LAB_004414d7;
  case sc_carry:
    pTVar4 = level.Scrolls.Array + this->m_Affectee;
    break;
  default:
    goto switchD_00441367_default;
  }
  pdVar6 = &pTVar4->Y;
  ((TVector2<double> *)(pdVar6 + -1))->X = ((TVector2<double> *)(pdVar6 + -1))->X + dVar7;
  tdy = dVar9;
LAB_004414d7:
  *pdVar6 = tdy + *pdVar6;
switchD_00441367_default:
  return;
}

Assistant:

void DScroller::Tick ()
{
	double dx = m_dx, dy = m_dy, tdx, tdy;

	if (m_Control != -1)
	{	// compute scroll amounts based on a sector's height changes
		double height = sectors[m_Control].CenterFloor () +
						 sectors[m_Control].CenterCeiling ();
		double delta = height - m_LastHeight;
		m_LastHeight = height;
		dx *= delta;
		dy *= delta;
	}

	// killough 3/14/98: Add acceleration
	if (m_Accel)
	{
		m_vdx = dx += m_vdx;
		m_vdy = dy += m_vdy;
	}

	if (dx == 0 && dy == 0)
		return;

	switch (m_Type)
	{
		case EScroll::sc_side:					// killough 3/7/98: Scroll wall texture
			if (m_Parts & EScrollPos::scw_top)
			{
				sides[m_Affectee].AddTextureXOffset(side_t::top, dx);
				sides[m_Affectee].AddTextureYOffset(side_t::top, dy);
			}
			if (m_Parts & EScrollPos::scw_mid && (sides[m_Affectee].linedef->backsector == NULL ||
				!(sides[m_Affectee].linedef->flags&ML_3DMIDTEX)))
			{
				sides[m_Affectee].AddTextureXOffset(side_t::mid, dx);
				sides[m_Affectee].AddTextureYOffset(side_t::mid, dy);
			}
			if (m_Parts & EScrollPos::scw_bottom)
			{
				sides[m_Affectee].AddTextureXOffset(side_t::bottom, dx);
				sides[m_Affectee].AddTextureYOffset(side_t::bottom, dy);
			}
			break;

		case EScroll::sc_floor:						// killough 3/7/98: Scroll floor texture
			RotationComp(&sectors[m_Affectee], sector_t::floor, dx, dy, tdx, tdy);
			sectors[m_Affectee].AddXOffset(sector_t::floor, tdx);
			sectors[m_Affectee].AddYOffset(sector_t::floor, tdy);
			break;

		case EScroll::sc_ceiling:					// killough 3/7/98: Scroll ceiling texture
			RotationComp(&sectors[m_Affectee], sector_t::ceiling, dx, dy, tdx, tdy);
			sectors[m_Affectee].AddXOffset(sector_t::ceiling, tdx);
			sectors[m_Affectee].AddYOffset(sector_t::ceiling, tdy);
			break;

		// [RH] Don't actually carry anything here. That happens later.
		case EScroll::sc_carry:
			level.Scrolls[m_Affectee].X += dx;
			level.Scrolls[m_Affectee].Y += dy;
			break;

		case EScroll::sc_carry_ceiling:       // to be added later
			break;
	}
}